

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O2

void __thiscall Connection::onSocketError(Connection *this,SharedPtr *param_1,Error error)

{
  int *piVar1;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  Log local_70;
  Log local_60;
  undefined1 local_50 [32];
  Log local_30;
  
  local_90.mValue = 1;
  Log::Log((Log *)(local_50 + 0x10),LogLevel::Warning,(Flags<LogOutput::LogFlag> *)&local_90);
  Log::operator<<(&local_70,(char *)(local_50 + 0x10));
  Log::addStringStream<int>(&local_60,(int)&local_70);
  piVar1 = __errno_location();
  Log::addStringStream<int>((Log *)local_50,(int)&local_60);
  Rct::strerror((Rct *)&local_90,*piVar1);
  operator<<(&local_30,(String *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mError,
             (shared_ptr<Connection> *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            ((__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
  return;
}

Assistant:

void onSocketError(const SocketClient::SharedPtr&, SocketClient::Error error)
    {
        ::warning() << "Socket error" << error << errno << Rct::strerror();
        mError(shared_from_this());
        mDisconnected(shared_from_this());
    }